

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typebase.h
# Opt level: O0

string * __thiscall
ICM::TypeBase::ErrorType::to_string_abi_cxx11_(string *__return_storage_ptr__,ErrorType *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  ErrorType *local_18;
  ErrorType *this_local;
  
  local_18 = this;
  this_local = (ErrorType *)__return_storage_ptr__;
  std::operator+(&local_38,"Error(",&this->msg);
  std::operator+(__return_storage_ptr__,&local_38,")");
  std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

string to_string() const {
				return "Error(" + msg + ")";
			}